

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

void tcu::fillWithMetaballs(PixelBufferAccess *dst,int numBalls,deUint32 seed)

{
  int i_1;
  int iVar1;
  pointer pVVar2;
  InternalError *this;
  long lVar3;
  int x;
  ulong uVar4;
  int y;
  float fVar5;
  float fVar6;
  Vec2 d;
  Vec2 p;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> points;
  Random rnd;
  Vec4 local_68;
  float local_58 [2];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_50;
  deRandom local_38;
  
  if ((dst->super_ConstPixelBufferAccess).m_size.m_data[2] == 1) {
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
              (&local_50,(long)numBalls,(allocator_type *)&local_38);
    deRandom_init(&local_38,seed);
    if (0 < numBalls) {
      uVar4 = 0;
      do {
        fVar5 = deRandom_getFloat(&local_38);
        fVar6 = deRandom_getFloat(&local_38);
        local_50.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar4].m_data[0] = fVar5;
        local_50.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar4].m_data[1] = fVar6;
        uVar4 = uVar4 + 1;
      } while ((uint)numBalls != uVar4);
    }
    if (0 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]) {
      y = 0;
      do {
        iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
        if (0 < iVar1) {
          x = 0;
          do {
            local_58[0] = (float)x / (float)iVar1;
            local_58[1] = (float)y / (float)(dst->super_ConstPixelBufferAccess).m_size.m_data[1];
            fVar5 = 0.0;
            for (pVVar2 = local_50.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pVVar2 != local_50.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish; pVVar2 = pVVar2 + 1) {
              local_68.m_data[0] = 0.0;
              local_68.m_data[1] = 0.0;
              lVar3 = 0;
              do {
                local_68.m_data[lVar3] = local_58[lVar3] - pVVar2->m_data[lVar3];
                lVar3 = lVar3 + 1;
              } while (lVar3 == 1);
              fVar5 = fVar5 + 0.01 / (local_68.m_data[0] * local_68.m_data[0] +
                                     local_68.m_data[1] * local_68.m_data[1]);
            }
            lVar3 = 0;
            do {
              local_68.m_data[lVar3] = fVar5;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
            PixelBufferAccess::setPixel(dst,&local_68,x,y,0);
            x = x + 1;
            iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
          } while (x < iVar1);
        }
        y = y + 1;
      } while (y < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]);
    }
    if (local_50.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this,(char *)0x0,"dst.getDepth() == 1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuTextureUtil.cpp"
             ,0x3d7);
  __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

void fillWithMetaballs (const PixelBufferAccess& dst, int numBalls, deUint32 seed)
{
	TCU_CHECK_INTERNAL(dst.getDepth() == 1);
	std::vector<Vec2>	points(numBalls);
	de::Random			rnd(seed);

	for (int i = 0; i < numBalls; i++)
	{
		float x = rnd.getFloat();
		float y = rnd.getFloat();
		points[i] = (Vec2(x, y));
	}

	for (int y = 0; y < dst.getHeight(); y++)
	for (int x = 0; x < dst.getWidth(); x++)
	{
		Vec2 p((float)x/(float)dst.getWidth(), (float)y/(float)dst.getHeight());

		float sum = 0.0f;
		for (std::vector<Vec2>::const_iterator i = points.begin(); i != points.end(); i++)
		{
			Vec2	d = p - *i;
			float	f = 0.01f / (d.x()*d.x() + d.y()*d.y());

			sum += f;
		}

		dst.setPixel(Vec4(sum), x, y);
	}
}